

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_check_dup_identities(lysp_ctx *ctx,lysp_module *mod)

{
  ly_ht *ht_00;
  bool bVar1;
  ly_ht *local_50;
  LY_ERR local_3c;
  lysp_ident *plStack_38;
  LY_ERR ret;
  lysp_ident *i;
  ly_ht *ht;
  uint64_t u;
  lysp_module *mod_local;
  lysp_ctx *ctx_local;
  
  local_3c = LY_SUCCESS;
  ht_00 = lyht_new(8,8,ly_ptrequal_cb,(void *)0x0,1);
  if (ht_00 == (ly_ht *)0x0) {
    return LY_EMEM;
  }
  plStack_38 = mod->identities;
  while( true ) {
    bVar1 = false;
    if (mod->identities != (lysp_ident *)0x0) {
      bVar1 = (ulong)((long)plStack_38 - (long)mod->identities) / 0x38 <
              *(ulong *)&mod->identities[-1].flags;
    }
    if (!bVar1) break;
    local_3c = lysp_check_dup_ht_insert
                         (ctx,ht_00,plStack_38->name,"identity",
                          "name collision with another top-level identity");
    if (local_3c != LY_SUCCESS) goto LAB_0019f105;
    plStack_38 = plStack_38 + 1;
  }
  ht = (ly_ht *)0x0;
  while( true ) {
    if (mod->includes == (lysp_include *)0x0) {
      local_50 = (ly_ht *)0x0;
    }
    else {
      local_50 = *(ly_ht **)(mod->includes[-1].rev + 8);
    }
    if (local_50 <= ht) break;
    plStack_38 = (mod->includes[(long)ht].submodule)->identities;
    while( true ) {
      bVar1 = false;
      if ((mod->includes[(long)ht].submodule)->identities != (lysp_ident *)0x0) {
        bVar1 = (ulong)((long)plStack_38 - (long)(mod->includes[(long)ht].submodule)->identities) /
                0x38 < *(ulong *)&(mod->includes[(long)ht].submodule)->identities[-1].flags;
      }
      if (!bVar1) break;
      local_3c = lysp_check_dup_ht_insert
                           (ctx,ht_00,plStack_38->name,"identity",
                            "name collision with another top-level identity");
      if (local_3c != LY_SUCCESS) goto LAB_0019f105;
      plStack_38 = plStack_38 + 1;
    }
    ht = (ly_ht *)((long)&ht->used + 1);
  }
LAB_0019f105:
  lyht_free(ht_00,(_func_void_void_ptr *)0x0);
  return local_3c;
}

Assistant:

LY_ERR
lysp_check_dup_identities(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ht *ht;
    struct lysp_ident *i;
    LY_ERR ret = LY_SUCCESS;

    ht = lyht_new(LYHT_MIN_SIZE, sizeof(void *), ly_ptrequal_cb, NULL, 1);
    LY_CHECK_RET(!ht, LY_EMEM);

    /* add all module identities into a hash table */
    LY_ARRAY_FOR(mod->identities, struct lysp_ident, i) {
        ret = lysp_check_dup_ht_insert(ctx, ht, i->name, "identity",
                "name collision with another top-level identity");
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* add all submodule identities into a hash table */
    LY_ARRAY_FOR(mod->includes, u) {
        LY_ARRAY_FOR(mod->includes[u].submodule->identities, struct lysp_ident, i) {
            ret = lysp_check_dup_ht_insert(ctx, ht, i->name, "identity",
                    "name collision with another top-level identity");
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ht, NULL);
    return ret;
}